

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_reserve_failure_noMemoryAvailable_fn(int _i)

{
  bool bVar1;
  char *pcVar2;
  char *expr;
  ulong uVar3;
  int line;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  ulong local_30;
  ulong local_28;
  void *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = 8;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_20 = private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  for (uVar3 = 0; uVar3 < 7; uVar3 = uVar3 + 1) {
    *(undefined1 *)((long)local_20 + uVar3) = 0x35;
  }
  *(undefined1 *)((long)local_20 + 7) = 0x30;
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  bVar1 = private_ACUtils_ADynArray_reserve(&local_48,0x20,false,1);
  if (bVar1 == false) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x126);
    if (local_30 == 8) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x127);
      if (local_28 == 8) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x128);
        if (local_20 == (void *)0x0) {
          pcVar7 = (char *)0x0;
          expr = "Assertion \'_ck_x != NULL\' failed";
          pcVar2 = "Assertion \'%s\' failed: %s == %#x";
          pcVar4 = "(void*) array.buffer != NULL";
          pcVar5 = "(void*) array.buffer";
          line = 0x129;
          uVar3 = 0;
        }
        else {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x129);
          for (lVar6 = 0; lVar6 != 7; lVar6 = lVar6 + 1) {
            if ((long)*(char *)((long)local_20 + lVar6) != 0x35) {
              pcVar7 = "\'5\'";
              expr = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
              pcVar4 = "array.buffer[i] == \'5\'";
              pcVar5 = "array.buffer[i]";
              line = 299;
              uVar3 = (long)*(char *)((long)local_20 + lVar6);
              goto LAB_0010bb83;
            }
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,299);
          }
          if ((long)*(char *)((long)local_20 + 7) == 0x30) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,300);
            if (local_38 != (code *)0x0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x12d);
              (*pcStack_40)(local_20);
              return;
            }
            pcVar7 = (char *)0x0;
            expr = "Assertion \'_ck_x != NULL\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %#x";
            pcVar4 = "(void*) array.growStrategy != NULL";
            pcVar5 = "(void*) array.growStrategy";
            line = 0x12d;
            uVar3 = 0;
          }
          else {
            pcVar7 = "\'0\'";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
            pcVar4 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'";
            pcVar5 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]";
            line = 300;
            uVar3 = (long)*(char *)((long)local_20 + 7);
          }
        }
      }
      else {
        pcVar7 = "private_ACUtilsTest_ADynArray_capacityMin";
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar4 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMin";
        pcVar5 = "array.capacity";
        line = 0x128;
        uVar3 = local_28;
      }
    }
    else {
      pcVar7 = "private_ACUtilsTest_ADynArray_capacityMin";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar4 = "array.size == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar5 = "array.size";
      line = 0x127;
      uVar3 = local_30;
    }
  }
  else {
    uVar3 = (ulong)bVar1;
    pcVar7 = "false";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(&array)->buffer)) == false"
    ;
    pcVar5 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(&array)->buffer))"
    ;
    line = 0x126;
  }
LAB_0010bb83:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,expr,pcVar2,pcVar4,pcVar5,uVar3,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_reserve_failure_noMemoryAvailable)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.deallocator(array.buffer);
}